

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrint_abi_cxx11_
          (TransitionObservationIndependentMADPDiscrete *this)

{
  TransitionObservationIndependentMADPDiscrete *in_stack_00000468;
  
  SoftPrint_abi_cxx11_(in_stack_00000468);
  return;
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrint() const
{    
    stringstream str;
    str << MultiAgentDecisionProcess::SoftPrint();
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::Print("<< 
            ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    str << "#joint states=" << GetNrJointStates() << endl;
    str << "#joint actions="<<GetNrJointActions()<<endl;
    str << "#joint observations="<<GetNrJointObservations()<<endl;
    str << SoftPrintActionSets();
    str << "Joint Actions:"<<endl;
    str << SoftPrintJointActionSet();
    //print the individual MADPs
    str << "Individual MADPs for each agent:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        str << "Agent "<< agI << ":" <<endl << 
            GetIndividualMADPD(agI)->SoftPrint();
    
    return(str.str());
}